

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::_parse_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (value *out,
               input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  array *this;
  bool bVar1;
  int iVar2;
  reference out_00;
  value local_58;
  array *local_48;
  array *a;
  value local_30;
  input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  value *out_local;
  
  local_20 = in;
  in_local = (input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)out;
  value::value(&local_30,4,false);
  value::operator=((value *)in_local,&local_30);
  value::~value(&local_30);
  local_48 = value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                       ((value *)in_local);
  iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::expect(local_20,0x5d);
  if (iVar2 == 0) {
    do {
      this = local_48;
      value::value(&local_58);
      std::vector<picojson::value,_std::allocator<picojson::value>_>::push_back(this,&local_58);
      value::~value(&local_58);
      out_00 = std::vector<picojson::value,_std::allocator<picojson::value>_>::back(local_48);
      bVar1 = _parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(out_00,local_20);
      if (!bVar1) {
        return false;
      }
      iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(local_20,0x2c);
    } while (iVar2 != 0);
    iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(local_20,0x5d);
    out_local._7_1_ = iVar2 != 0;
  }
  else {
    out_local._7_1_ = true;
  }
  return out_local._7_1_;
}

Assistant:

inline bool _parse_array(value& out, input<Iter>& in) {
    out = value(array_type, false);
    array& a = out.get<array>();
    if (in.expect(']')) {
      return true;
    }
    do {
      a.push_back(value());
      if (! _parse(a.back(), in)) {
	return false;
      }
    } while (in.expect(','));
    return in.expect(']');
  }